

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void MPLSParser::composeExtensionData
               (BitStreamWriter *writer,
               vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *extDataBlockInfo)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint value;
  int iVar4;
  uint32_t uVar5;
  size_type sVar6;
  uint8_t *puVar7;
  const_reference pvVar8;
  uint8_t *puVar9;
  reference ppuVar10;
  byte *pbVar11;
  uchar *j;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  uint i_1;
  uint i;
  uint extDataBlockInfoSize;
  int initPos;
  uint32_t *lengthPos;
  undefined1 local_30 [8];
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> extDataStartAddrPos;
  vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *extDataBlockInfo_local;
  BitStreamWriter *writer_local;
  
  extDataStartAddrPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)extDataBlockInfo;
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_30);
  sVar6 = std::vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>::size
                    ((vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *)
                     extDataStartAddrPos.
                     super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::resize
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_30,sVar6);
  puVar7 = BitStream::getBuffer(&writer->super_BitStream);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 7;
  }
  BitStreamWriter::putBits(writer,0x20,0);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  iVar3 = iVar3 / 8;
  bVar1 = std::vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>::empty
                    ((vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *)
                     extDataStartAddrPos.
                     super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x18,0);
    sVar6 = std::vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>::size
                      ((vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *)
                       extDataStartAddrPos.
                       super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    value = (uint)sVar6;
    BitStreamWriter::putBits(writer,8,value);
    for (__range3._4_4_ = 0; __range3._4_4_ < value; __range3._4_4_ = __range3._4_4_ + 1) {
      pvVar8 = std::vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>::operator[]
                         ((vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *)
                          extDataStartAddrPos.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)__range3._4_4_);
      BitStreamWriter::putBits(writer,0x10,pvVar8->id1);
      pvVar8 = std::vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>::operator[]
                         ((vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *)
                          extDataStartAddrPos.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)__range3._4_4_);
      BitStreamWriter::putBits(writer,0x10,pvVar8->id2);
      puVar9 = BitStream::getBuffer(&writer->super_BitStream);
      iVar4 = BitStreamWriter::getBitsCount(writer);
      if (iVar4 < 0) {
        iVar4 = iVar4 + 7;
      }
      ppuVar10 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                           ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_30,
                            (ulong)__range3._4_4_);
      *ppuVar10 = (value_type)(puVar9 + (iVar4 >> 3));
      BitStreamWriter::putBits(writer,0x20,0);
      pvVar8 = std::vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>::operator[]
                         ((vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *)
                          extDataStartAddrPos.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)__range3._4_4_);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pvVar8->data);
      BitStreamWriter::putBits(writer,0x20,(uint)sVar6);
    }
    while (iVar4 = BitStreamWriter::getBitsCount(writer), (iVar4 / 8 - iVar3) % 4 != 0) {
      BitStreamWriter::putBits(writer,0x10,0);
    }
    iVar4 = BitStreamWriter::getBitsCount(writer);
    if (iVar4 < 0) {
      iVar4 = iVar4 + 7;
    }
    uVar5 = my_ntohl(((iVar4 >> 3) - iVar3) + 4);
    *(uint32_t *)((long)(puVar7 + (iVar2 >> 3)) + 4) = uVar5;
    for (__range3._0_4_ = 0; (uint)__range3 < value; __range3._0_4_ = (uint)__range3 + 1) {
      iVar4 = BitStreamWriter::getBitsCount(writer);
      if (iVar4 < 0) {
        iVar4 = iVar4 + 7;
      }
      uVar5 = my_ntohl(((iVar4 >> 3) - iVar3) + 4);
      ppuVar10 = std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::operator[]
                           ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_30,
                            (ulong)(uint)__range3);
      **ppuVar10 = uVar5;
      pvVar8 = std::vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_>::operator[]
                         ((vector<ExtDataBlockInfo,_std::allocator<ExtDataBlockInfo>_> *)
                          extDataStartAddrPos.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)__range3);
      __end3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&pvVar8->data);
      j = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&pvVar8->data);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&j), bVar1) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator*(&__end3);
        BitStreamWriter::putBits(writer,8,(uint)*pbVar11);
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&__end3);
      }
    }
  }
  iVar4 = BitStreamWriter::getBitsCount(writer);
  if (iVar4 < 0) {
    iVar4 = iVar4 + 7;
  }
  uVar5 = my_ntohl((iVar4 >> 3) - iVar3);
  *(uint32_t *)(puVar7 + (iVar2 >> 3)) = uVar5;
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~vector
            ((vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> *)local_30);
  return;
}

Assistant:

void MPLSParser::composeExtensionData(BitStreamWriter& writer, const vector<ExtDataBlockInfo>& extDataBlockInfo)
{
    vector<uint32_t*> extDataStartAddrPos;
    extDataStartAddrPos.resize(extDataBlockInfo.size());
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int initPos = writer.getBitsCount() / 8;
    if (!extDataBlockInfo.empty())
    {
        writer.putBits(32, 0);  // data_block_start_address
        writer.putBits(24, 0);  // reserved_for_word_align
        const auto extDataBlockInfoSize = static_cast<unsigned>(extDataBlockInfo.size());
        writer.putBits(8, extDataBlockInfoSize);
        for (unsigned i = 0; i < extDataBlockInfoSize; ++i)
        {
            writer.putBits(16, extDataBlockInfo[i].id1);
            writer.putBits(16, extDataBlockInfo[i].id2);
            extDataStartAddrPos[i] = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
            writer.putBits(32, 0);                                                       // ext_data_start_address
            writer.putBits(32, static_cast<unsigned>(extDataBlockInfo[i].data.size()));  // ext_data_length
        }
        while ((writer.getBitsCount() / 8 - initPos) % 4 != 0) writer.putBits(16, 0);
        *(lengthPos + 1) = my_htonl(writer.getBitsCount() / 8 - initPos + 4);  // data_block_start_address
        for (unsigned i = 0; i < extDataBlockInfoSize; ++i)
        {
            *(extDataStartAddrPos[i]) = my_htonl(writer.getBitsCount() / 8 - initPos + 4);
            for (const auto& j : extDataBlockInfo[i].data) writer.putBits(8, j);
        }
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - initPos);
}